

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.h
# Opt level: O0

void __thiscall llvm::Twine::Twine(Twine *this,char *LHS,StringRef *RHS)

{
  bool bVar1;
  StringRef *RHS_local;
  char *LHS_local;
  Twine *this_local;
  
  (this->LHS).twine = (Twine *)0x0;
  (this->RHS).twine = (Twine *)0x0;
  this->LHSKind = CStringKind;
  this->RHSKind = StringRefKind;
  (this->LHS).cString = LHS;
  (this->RHS).stringRef = RHS;
  bVar1 = isValid(this);
  if (!bVar1) {
    __assert_fail("isValid() && \"Invalid twine!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/Twine.h"
                  ,0x169,"llvm::Twine::Twine(const char *, const StringRef &)");
  }
  return;
}

Assistant:

Twine(const char *LHS, const StringRef &RHS)
        : LHSKind(CStringKind), RHSKind(StringRefKind) {
      this->LHS.cString = LHS;
      this->RHS.stringRef = &RHS;
      assert(isValid() && "Invalid twine!");
    }